

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O2

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  undefined1 *puVar1;
  connectdata *conn;
  bool bVar2;
  char cVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  char *pcVar7;
  size_t sVar8;
  curl_slist *pcVar9;
  curl_slist *pcVar10;
  size_t length;
  char *pcVar11;
  char *pcVar12;
  uchar *puVar13;
  uchar *data_00;
  char *pcVar14;
  uchar *data_01;
  uchar *key;
  size_t sVar15;
  size_t dst_l;
  size_t dst_l_00;
  size_t dst_l_01;
  curl_slist *pcVar16;
  int iVar17;
  char *tmp;
  ulong uVar18;
  char *pcVar19;
  curl_slist **ppcVar20;
  curl_slist *l;
  curl_slist *pcVar21;
  bool bVar22;
  CURLcode local_464;
  char *local_448;
  CURLcode local_440;
  char timestamp [17];
  uchar sign0 [32];
  Curl_HttpReq httpreq;
  uchar sign1 [32];
  char service [65];
  char region [65];
  char provider0 [65];
  dynbuf signed_headers;
  char provider1 [65];
  char *method;
  dynbuf canonical_headers;
  time_t clock;
  char date_hdr_key [72];
  uchar sha_hash [32];
  tm tm;
  char sha_hex [65];
  
  conn = data->conn;
  provider0[0x40] = '\0';
  provider0[0x30] = '\0';
  provider0[0x31] = '\0';
  provider0[0x32] = '\0';
  provider0[0x33] = '\0';
  provider0[0x34] = '\0';
  provider0[0x35] = '\0';
  provider0[0x36] = '\0';
  provider0[0x37] = '\0';
  provider0[0x38] = '\0';
  provider0[0x39] = '\0';
  provider0[0x3a] = '\0';
  provider0[0x3b] = '\0';
  provider0[0x3c] = '\0';
  provider0[0x3d] = '\0';
  provider0[0x3e] = '\0';
  provider0[0x3f] = '\0';
  provider0[0x20] = '\0';
  provider0[0x21] = '\0';
  provider0[0x22] = '\0';
  provider0[0x23] = '\0';
  provider0[0x24] = '\0';
  provider0[0x25] = '\0';
  provider0[0x26] = '\0';
  provider0[0x27] = '\0';
  provider0[0x28] = '\0';
  provider0[0x29] = '\0';
  provider0[0x2a] = '\0';
  provider0[0x2b] = '\0';
  provider0[0x2c] = '\0';
  provider0[0x2d] = '\0';
  provider0[0x2e] = '\0';
  provider0[0x2f] = '\0';
  provider0[0x10] = '\0';
  provider0[0x11] = '\0';
  provider0[0x12] = '\0';
  provider0[0x13] = '\0';
  provider0[0x14] = '\0';
  provider0[0x15] = '\0';
  provider0[0x16] = '\0';
  provider0[0x17] = '\0';
  provider0[0x18] = '\0';
  provider0[0x19] = '\0';
  provider0[0x1a] = '\0';
  provider0[0x1b] = '\0';
  provider0[0x1c] = '\0';
  provider0[0x1d] = '\0';
  provider0[0x1e] = '\0';
  provider0[0x1f] = '\0';
  provider0[0] = '\0';
  provider0[1] = '\0';
  provider0[2] = '\0';
  provider0[3] = '\0';
  provider0[4] = '\0';
  provider0[5] = '\0';
  provider0[6] = '\0';
  provider0[7] = '\0';
  provider0[8] = '\0';
  provider0[9] = '\0';
  provider0[10] = '\0';
  provider0[0xb] = '\0';
  provider0[0xc] = '\0';
  provider0[0xd] = '\0';
  provider0[0xe] = '\0';
  provider0[0xf] = '\0';
  provider1[0x40] = '\0';
  provider1[0x30] = '\0';
  provider1[0x31] = '\0';
  provider1[0x32] = '\0';
  provider1[0x33] = '\0';
  provider1[0x34] = '\0';
  provider1[0x35] = '\0';
  provider1[0x36] = '\0';
  provider1[0x37] = '\0';
  provider1[0x38] = '\0';
  provider1[0x39] = '\0';
  provider1[0x3a] = '\0';
  provider1[0x3b] = '\0';
  provider1[0x3c] = '\0';
  provider1[0x3d] = '\0';
  provider1[0x3e] = '\0';
  provider1[0x3f] = '\0';
  provider1[0x20] = '\0';
  provider1[0x21] = '\0';
  provider1[0x22] = '\0';
  provider1[0x23] = '\0';
  provider1[0x24] = '\0';
  provider1[0x25] = '\0';
  provider1[0x26] = '\0';
  provider1[0x27] = '\0';
  provider1[0x28] = '\0';
  provider1[0x29] = '\0';
  provider1[0x2a] = '\0';
  provider1[0x2b] = '\0';
  provider1[0x2c] = '\0';
  provider1[0x2d] = '\0';
  provider1[0x2e] = '\0';
  provider1[0x2f] = '\0';
  provider1[0x10] = '\0';
  provider1[0x11] = '\0';
  provider1[0x12] = '\0';
  provider1[0x13] = '\0';
  provider1[0x14] = '\0';
  provider1[0x15] = '\0';
  provider1[0x16] = '\0';
  provider1[0x17] = '\0';
  provider1[0x18] = '\0';
  provider1[0x19] = '\0';
  provider1[0x1a] = '\0';
  provider1[0x1b] = '\0';
  provider1[0x1c] = '\0';
  provider1[0x1d] = '\0';
  provider1[0x1e] = '\0';
  provider1[0x1f] = '\0';
  provider1[0] = '\0';
  provider1[1] = '\0';
  provider1[2] = '\0';
  provider1[3] = '\0';
  provider1[4] = '\0';
  provider1[5] = '\0';
  provider1[6] = '\0';
  provider1[7] = '\0';
  provider1[8] = '\0';
  provider1[9] = '\0';
  provider1[10] = '\0';
  provider1[0xb] = '\0';
  provider1[0xc] = '\0';
  provider1[0xd] = '\0';
  provider1[0xe] = '\0';
  provider1[0xf] = '\0';
  region[0x40] = '\0';
  region[0x30] = '\0';
  region[0x31] = '\0';
  region[0x32] = '\0';
  region[0x33] = '\0';
  region[0x34] = '\0';
  region[0x35] = '\0';
  region[0x36] = '\0';
  region[0x37] = '\0';
  region[0x38] = '\0';
  region[0x39] = '\0';
  region[0x3a] = '\0';
  region[0x3b] = '\0';
  region[0x3c] = '\0';
  region[0x3d] = '\0';
  region[0x3e] = '\0';
  region[0x3f] = '\0';
  region[0x20] = '\0';
  region[0x21] = '\0';
  region[0x22] = '\0';
  region[0x23] = '\0';
  region[0x24] = '\0';
  region[0x25] = '\0';
  region[0x26] = '\0';
  region[0x27] = '\0';
  region[0x28] = '\0';
  region[0x29] = '\0';
  region[0x2a] = '\0';
  region[0x2b] = '\0';
  region[0x2c] = '\0';
  region[0x2d] = '\0';
  region[0x2e] = '\0';
  region[0x2f] = '\0';
  region[0x10] = '\0';
  region[0x11] = '\0';
  region[0x12] = '\0';
  region[0x13] = '\0';
  region[0x14] = '\0';
  region[0x15] = '\0';
  region[0x16] = '\0';
  region[0x17] = '\0';
  region[0x18] = '\0';
  region[0x19] = '\0';
  region[0x1a] = '\0';
  region[0x1b] = '\0';
  region[0x1c] = '\0';
  region[0x1d] = '\0';
  region[0x1e] = '\0';
  region[0x1f] = '\0';
  region[0] = '\0';
  region[1] = '\0';
  region[2] = '\0';
  region[3] = '\0';
  region[4] = '\0';
  region[5] = '\0';
  region[6] = '\0';
  region[7] = '\0';
  region[8] = '\0';
  region[9] = '\0';
  region[10] = '\0';
  region[0xb] = '\0';
  region[0xc] = '\0';
  region[0xd] = '\0';
  region[0xe] = '\0';
  region[0xf] = '\0';
  service[0x40] = '\0';
  service[0x30] = '\0';
  service[0x31] = '\0';
  service[0x32] = '\0';
  service[0x33] = '\0';
  service[0x34] = '\0';
  service[0x35] = '\0';
  service[0x36] = '\0';
  service[0x37] = '\0';
  service[0x38] = '\0';
  service[0x39] = '\0';
  service[0x3a] = '\0';
  service[0x3b] = '\0';
  service[0x3c] = '\0';
  service[0x3d] = '\0';
  service[0x3e] = '\0';
  service[0x3f] = '\0';
  service[0x20] = '\0';
  service[0x21] = '\0';
  service[0x22] = '\0';
  service[0x23] = '\0';
  service[0x24] = '\0';
  service[0x25] = '\0';
  service[0x26] = '\0';
  service[0x27] = '\0';
  service[0x28] = '\0';
  service[0x29] = '\0';
  service[0x2a] = '\0';
  service[0x2b] = '\0';
  service[0x2c] = '\0';
  service[0x2d] = '\0';
  service[0x2e] = '\0';
  service[0x2f] = '\0';
  service[0x10] = '\0';
  service[0x11] = '\0';
  service[0x12] = '\0';
  service[0x13] = '\0';
  service[0x14] = '\0';
  service[0x15] = '\0';
  service[0x16] = '\0';
  service[0x17] = '\0';
  service[0x18] = '\0';
  service[0x19] = '\0';
  service[0x1a] = '\0';
  service[0x1b] = '\0';
  service[0x1c] = '\0';
  service[0x1d] = '\0';
  service[0x1e] = '\0';
  service[0x1f] = '\0';
  service[0] = '\0';
  service[1] = '\0';
  service[2] = '\0';
  service[3] = '\0';
  service[4] = '\0';
  service[5] = '\0';
  service[6] = '\0';
  service[7] = '\0';
  service[8] = '\0';
  service[9] = '\0';
  service[10] = '\0';
  service[0xb] = '\0';
  service[0xc] = '\0';
  service[0xd] = '\0';
  service[0xe] = '\0';
  service[0xf] = '\0';
  pcVar14 = (conn->host).name;
  puVar13 = (uchar *)(data->set).postfields;
  pcVar19 = (data->state).aptr.user;
  if (pcVar19 == (char *)0x0) {
    pcVar19 = "";
  }
  sign0[0x10] = '\0';
  sign0[0x11] = '\0';
  sign0[0x12] = '\0';
  sign0[0x13] = '\0';
  sign0[0x14] = '\0';
  sign0[0x15] = '\0';
  sign0[0x16] = '\0';
  sign0[0x17] = '\0';
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  sign0[0] = '\0';
  sign0[1] = '\0';
  sign0[2] = '\0';
  sign0[3] = '\0';
  sign0[4] = '\0';
  sign0[5] = '\0';
  sign0[6] = '\0';
  sign0[7] = '\0';
  sign0[8] = '\0';
  sign0[9] = '\0';
  sign0[10] = '\0';
  sign0[0xb] = '\0';
  sign0[0xc] = '\0';
  sign0[0xd] = '\0';
  sign0[0xe] = '\0';
  sign0[0xf] = '\0';
  sign1[0x10] = '\0';
  sign1[0x11] = '\0';
  sign1[0x12] = '\0';
  sign1[0x13] = '\0';
  sign1[0x14] = '\0';
  sign1[0x15] = '\0';
  sign1[0x16] = '\0';
  sign1[0x17] = '\0';
  sign1[0x18] = '\0';
  sign1[0x19] = '\0';
  sign1[0x1a] = '\0';
  sign1[0x1b] = '\0';
  sign1[0x1c] = '\0';
  sign1[0x1d] = '\0';
  sign1[0x1e] = '\0';
  sign1[0x1f] = '\0';
  sign1[0] = '\0';
  sign1[1] = '\0';
  sign1[2] = '\0';
  sign1[3] = '\0';
  sign1[4] = '\0';
  sign1[5] = '\0';
  sign1[6] = '\0';
  sign1[7] = '\0';
  sign1[8] = '\0';
  sign1[9] = '\0';
  sign1[10] = '\0';
  sign1[0xb] = '\0';
  sign1[0xc] = '\0';
  sign1[0xd] = '\0';
  sign1[0xe] = '\0';
  sign1[0xf] = '\0';
  pcVar7 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar7 != (char *)0x0) {
    return CURLE_OK;
  }
  Curl_dyn_init(&canonical_headers,0x19000);
  Curl_dyn_init(&signed_headers,0x19000);
  pcVar7 = (data->set).str[0x4e];
  pcVar11 = "aws:amz";
  if (pcVar7 != (char *)0x0) {
    pcVar11 = pcVar7;
  }
  __isoc99_sscanf(pcVar11,"%64[^:]:%64[^:]:%64[^:]:%64s",provider0,provider1,region,service);
  if (provider0[0] == '\0') {
    Curl_failf(data,"first provider can\'t be empty");
    CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    if (provider1[0] == '\0') {
      strcpy(provider1,provider0);
    }
    if (service[0] != '\0') goto LAB_0013a01e;
    pcVar7 = strchr(pcVar14,0x2e);
    if (pcVar7 == (char *)0x0) {
      pcVar14 = "service missing in parameters and hostname";
    }
    else {
      uVar18 = (long)pcVar7 - (long)pcVar14;
      if (uVar18 < 0x41) {
        strncpy(service,pcVar14,uVar18);
        service[uVar18] = '\0';
        if (region[0] != '\0') {
LAB_0013a01e:
          time(&clock);
          local_464 = Curl_gmtime(clock,&tm);
          if (local_464 == CURLE_OK) {
            sVar8 = strftime(timestamp,0x11,"%Y%m%dT%H%M%SZ",(tm *)&tm);
            CVar6 = CURLE_OUT_OF_MEMORY;
            local_464 = CVar6;
            if (sVar8 != 0) {
              sVar8 = strlen(provider1);
              Curl_strntolower(provider1,provider1,sVar8);
              cVar3 = Curl_raw_toupper(provider1[0]);
              provider1[0] = cVar3;
              pcVar9 = (curl_slist *)0x0;
              curl_msnprintf(date_hdr_key,0x48,"X-%s-Date",provider1);
              Curl_strntolower(provider1,provider1,1);
              curl_msnprintf((char *)sha_hash,0x5a,"x-%s-date:%s",provider1,timestamp);
              pcVar7 = Curl_checkheaders(data,"Host",4);
              if (pcVar7 == (char *)0x0) {
                local_440 = CURLE_URL_MALFORMAT;
                pcVar7 = (data->state).aptr.host;
                if (pcVar7 == (char *)0x0) {
                  sVar8 = strlen(pcVar14);
                  if (sVar8 < 0x100) {
                    curl_msnprintf(sha_hex,0x105,"host:%s",pcVar14);
                    goto LAB_0013a485;
                  }
                }
                else {
                  sVar8 = strlen(pcVar7);
                  if (sVar8 < 0x106) {
                    strcpy(sha_hex,pcVar7);
                    sVar8 = strcspn(sha_hex,"\n\r");
                    sha_hex[sVar8] = '\0';
LAB_0013a485:
                    pcVar9 = curl_slist_append((curl_slist *)0x0,sha_hex);
                    if (pcVar9 != (curl_slist *)0x0) goto LAB_0013a166;
                    local_440 = CURLE_OUT_OF_MEMORY;
                  }
                }
                local_448 = (char *)0x0;
                pcVar10 = (curl_slist *)0x0;
              }
              else {
LAB_0013a166:
                ppcVar20 = &(data->set).headers;
                local_448 = (char *)0x0;
                CVar5 = CURLE_OUT_OF_MEMORY;
                local_440 = CURLE_OUT_OF_MEMORY;
                do {
                  pcVar16 = *ppcVar20;
                  pcVar21 = pcVar9;
                  pcVar10 = pcVar9;
                  if (pcVar16 == (curl_slist *)0x0) goto LAB_0013a2a4;
                  pcVar9 = curl_slist_append(pcVar9,pcVar16->data);
                  ppcVar20 = &pcVar16->next;
                } while (pcVar9 != (curl_slist *)0x0);
              }
              goto LAB_0013a612;
            }
          }
          local_448 = (char *)0x0;
          CVar6 = local_464;
          goto LAB_0013a1d7;
        }
        pcVar7 = pcVar7 + 1;
        pcVar11 = strchr(pcVar7,0x2e);
        if (pcVar11 == (char *)0x0) {
          pcVar14 = "region missing in parameters and hostname";
        }
        else {
          uVar18 = (long)pcVar11 - (long)pcVar7;
          if (uVar18 < 0x41) {
            strncpy(region,pcVar7,uVar18);
            region[uVar18] = '\0';
            goto LAB_0013a01e;
          }
          pcVar14 = "region too long in hostname";
        }
      }
      else {
        pcVar14 = "service too long in hostname";
      }
    }
    Curl_failf(data,pcVar14);
    CVar6 = CURLE_URL_MALFORMAT;
  }
  local_448 = (char *)0x0;
  goto LAB_0013a1d7;
code_r0x0013a31e:
  bVar22 = cVar3 != '\0';
  cVar3 = '\0';
  pcVar14 = pcVar11;
  if (bVar22) {
    cVar3 = ' ';
LAB_0013a330:
    *pcVar7 = cVar3;
    pcVar7 = pcVar7 + 1;
    cVar3 = *pcVar14;
  }
  goto LAB_0013a2f8;
LAB_0013a2a4:
  for (; pcVar21 != (curl_slist *)0x0; pcVar21 = pcVar21->next) {
    pcVar14 = pcVar21->data;
    sVar8 = strcspn(pcVar14,":");
    Curl_strntolower(pcVar14,pcVar14,sVar8);
    if (pcVar21->data[sVar8] != '\0') {
      pcVar7 = pcVar21->data + sVar8 + 1;
      for (pcVar14 = pcVar7; (cVar3 = *pcVar14, cVar3 == '\t' || (cVar3 == ' '));
          pcVar14 = pcVar14 + 1) {
      }
LAB_0013a2f8:
      if (cVar3 != '\0') {
        iVar17 = 0;
        pcVar11 = pcVar14;
        while ((pcVar14 = pcVar11 + 1, cVar3 == ' ' || (cVar3 == '\t'))) {
          iVar17 = iVar17 + -1;
          pcVar11 = pcVar14;
          cVar3 = *pcVar14;
        }
        if (iVar17 != 0) goto code_r0x0013a31e;
        goto LAB_0013a330;
      }
      *pcVar7 = '\0';
    }
  }
  sVar8 = strlen(date_hdr_key);
  pcVar14 = Curl_checkheaders(data,date_hdr_key,sVar8);
  if ((pcVar14 == (char *)0x0) &&
     (pcVar14 = Curl_checkheaders(data,"Date",4), pcVar14 == (char *)0x0)) {
    pcVar10 = curl_slist_append(pcVar9,(char *)sha_hash);
    if (pcVar10 == (curl_slist *)0x0) {
LAB_0013a5fb:
      local_448 = (char *)0x0;
      pcVar10 = pcVar9;
    }
    else {
      local_448 = curl_maprintf("%s: %s",date_hdr_key,timestamp);
LAB_0013a529:
      pcVar9 = pcVar10;
      bVar22 = false;
      do {
        while (bVar2 = bVar22, pcVar16 = pcVar9, pcVar16 != (curl_slist *)0x0) {
          pcVar9 = pcVar16->next;
          bVar22 = bVar2;
          if (pcVar9 != (curl_slist *)0x0) {
            pcVar14 = pcVar16->data;
            pcVar7 = pcVar9->data;
            iVar17 = strcmp(pcVar14,pcVar7);
            if (0 < iVar17) {
              pcVar16->data = pcVar7;
              pcVar9->data = pcVar14;
              bVar22 = true;
            }
          }
        }
        pcVar9 = pcVar10;
        bVar22 = false;
      } while (bVar2);
      for (; pcVar9 != (curl_slist *)0x0; pcVar9 = pcVar9->next) {
        CVar4 = Curl_dyn_add(&canonical_headers,pcVar9->data);
        local_440 = CVar5;
        if ((CVar4 != CURLE_OK) ||
           (CVar4 = Curl_dyn_add(&canonical_headers,"\n"), CVar4 != CURLE_OK)) goto LAB_0013a612;
        pcVar14 = strchr(pcVar9->data,0x3a);
        if (pcVar14 != (char *)0x0) {
          *pcVar14 = '\0';
        }
        if (((pcVar9 != pcVar10) && (CVar4 = Curl_dyn_add(&signed_headers,";"), CVar4 != CURLE_OK))
           || (CVar4 = Curl_dyn_add(&signed_headers,pcVar9->data), CVar4 != CURLE_OK))
        goto LAB_0013a612;
      }
      local_440 = CURLE_OK;
    }
  }
  else {
    local_448 = (*Curl_cstrdup)(pcVar14);
    if (local_448 == (char *)0x0) goto LAB_0013a5fb;
    pcVar14 = strchr(local_448,0x3a);
    if (pcVar14 != (char *)0x0) {
      do {
        do {
          pcVar14 = pcVar14 + 1;
        } while (*pcVar14 == ' ');
      } while (*pcVar14 == '\t');
      strncpy(timestamp,pcVar14,0x10);
      timestamp[0x10] = '\0';
      goto LAB_0013a529;
    }
  }
LAB_0013a612:
  curl_slist_free_all(pcVar10);
  if (local_440 != CURLE_OK) {
    puVar13 = (uchar *)0x0;
    data_00 = (uchar *)0x0;
    pcVar14 = (char *)0x0;
    data_01 = (uchar *)0x0;
    key = (uchar *)0x0;
    local_464 = local_440;
    goto LAB_0013a1da;
  }
  date_hdr_key[0] = timestamp[0];
  date_hdr_key[1] = timestamp[1];
  date_hdr_key[2] = timestamp[2];
  date_hdr_key[3] = timestamp[3];
  date_hdr_key[4] = timestamp[4];
  date_hdr_key[5] = timestamp[5];
  date_hdr_key[6] = timestamp[6];
  date_hdr_key[7] = timestamp[7];
  date_hdr_key[8] = '\0';
  if (puVar13 == (uchar *)0x0) {
    length = 0;
  }
  else {
    length = (data->set).postfieldsize;
    if ((long)length < 0) {
      length = strlen((char *)puVar13);
    }
  }
  CVar5 = Curl_sha256it(sha_hash,puVar13,length);
  local_464 = CURLE_OUT_OF_MEMORY;
  if (CVar5 == CURLE_OK) {
    sha256_to_hex(sha_hex,sha_hash,dst_l);
    Curl_http_method(data,conn,&method,&httpreq);
    pcVar14 = (data->state).up.path;
    pcVar7 = (data->state).up.query;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    pcVar11 = Curl_dyn_ptr(&canonical_headers);
    pcVar12 = Curl_dyn_ptr(&signed_headers);
    puVar13 = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%s",method,pcVar14,pcVar7,pcVar11,pcVar12,
                                     sha_hex);
    if (puVar13 != (uchar *)0x0) {
      sVar8 = strlen(provider0);
      Curl_strntolower(provider0,provider0,sVar8);
      data_00 = (uchar *)curl_maprintf("%s4_request",provider0);
      if (data_00 == (uchar *)0x0) {
        data_00 = (uchar *)0x0;
        data_01 = (uchar *)0x0;
        pcVar14 = (char *)0x0;
        key = (uchar *)0x0;
      }
      else {
        pcVar14 = curl_maprintf("%s/%s/%s/%s",date_hdr_key,region,service,data_00);
        if (pcVar14 == (char *)0x0) {
          data_01 = (uchar *)0x0;
          pcVar14 = (char *)0x0;
          key = (uchar *)0x0;
          local_464 = CVar6;
        }
        else {
          sVar8 = strlen((char *)puVar13);
          CVar6 = Curl_sha256it(sha_hash,puVar13,sVar8);
          if (CVar6 == CURLE_OK) {
            sha256_to_hex(sha_hex,sha_hash,dst_l_00);
            sVar8 = strlen(provider0);
            Curl_strntoupper(provider0,provider0,sVar8);
            data_01 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",provider0,timestamp,
                                             pcVar14,sha_hex);
            if (data_01 == (uchar *)0x0) {
              data_01 = (uchar *)0x0;
            }
            else {
              pcVar7 = (data->state).aptr.passwd;
              pcVar11 = "";
              if (pcVar7 != (char *)0x0) {
                pcVar11 = pcVar7;
              }
              key = (uchar *)curl_maprintf("%s4%s",provider0,pcVar11);
              if (key != (uchar *)0x0) {
                sVar8 = strlen((char *)key);
                sVar15 = strlen(date_hdr_key);
                local_464 = Curl_hmacit(Curl_HMAC_SHA256,key,sVar8 & 0xffffffff,
                                        (uchar *)date_hdr_key,sVar15 & 0xffffffff,sign0);
                if (local_464 == CURLE_OK) {
                  sVar8 = strlen(region);
                  local_464 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,(uchar *)region,
                                          sVar8 & 0xffffffff,sign1);
                  if (local_464 == CURLE_OK) {
                    sVar8 = strlen(service);
                    local_464 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,(uchar *)service,
                                            sVar8 & 0xffffffff,sign0);
                    if (local_464 == CURLE_OK) {
                      sVar8 = strlen((char *)data_00);
                      local_464 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,data_00,sVar8 & 0xffffffff
                                              ,sign1);
                      if (local_464 == CURLE_OK) {
                        sVar8 = strlen((char *)data_01);
                        local_464 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,data_01,
                                                sVar8 & 0xffffffff,sign0);
                        if (local_464 == CURLE_OK) {
                          sha256_to_hex(sha_hex,sign0,dst_l_01);
                          pcVar7 = Curl_dyn_ptr(&signed_headers);
                          local_464 = CURLE_OK;
                          pcVar19 = curl_maprintf("Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s\r\n"
                                                  ,provider0,pcVar19,pcVar14,pcVar7,sha_hex,
                                                  local_448);
                          if (pcVar19 != (char *)0x0) {
                            (*Curl_cfree)((data->state).aptr.userpwd);
                            (data->state).aptr.userpwd = pcVar19;
                            puVar1 = &(data->state).authhost.field_0x18;
                            *puVar1 = *puVar1 | 1;
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0013a1da;
              }
            }
          }
          else {
            data_01 = (uchar *)0x0;
          }
          local_464 = CURLE_OUT_OF_MEMORY;
          key = (uchar *)0x0;
        }
      }
      goto LAB_0013a1da;
    }
  }
LAB_0013a1d7:
  local_464 = CVar6;
  data_01 = (uchar *)0x0;
  puVar13 = (uchar *)0x0;
  pcVar14 = (char *)0x0;
  data_00 = (uchar *)0x0;
  key = (uchar *)0x0;
LAB_0013a1da:
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  (*Curl_cfree)(puVar13);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(pcVar14);
  (*Curl_cfree)(data_01);
  (*Curl_cfree)(key);
  (*Curl_cfree)(local_448);
  return local_464;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode ret = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  char *date_header = NULL;
  const char *post_data = data->set.postfields;
  size_t post_data_len = 0;
  unsigned char sha_hash[32];
  char sha_hex[65];
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[32] = {0};
  unsigned char sign1[32] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init thoses buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
   */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first provider can't be empty");
    ret = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "service missing in parameters and hostname");
      ret = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "service too long in hostname");
      ret = CURLE_URL_MALFORMAT;
      goto fail;
    }
    strncpy(service, hostname, len);
    service[len] = '\0';

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "region missing in parameters and hostname");
        ret = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "region too long in hostname");
        ret = CURLE_URL_MALFORMAT;
        goto fail;
      }
      strncpy(region, reg, len);
      region[len] = '\0';
    }
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      time(&clock);
  }
#else
  time(&clock);
#endif
  ret = Curl_gmtime(clock, &tm);
  if(ret) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    ret = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  ret = make_headers(data, hostname, timestamp, provider1,
                     &date_header, &canonical_headers, &signed_headers);
  if(ret)
    goto fail;
  ret = CURLE_OUT_OF_MEMORY;

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  if(post_data) {
    if(data->set.postfieldsize < 0)
      post_data_len = strlen(post_data);
    else
      post_data_len = (size_t)data->set.postfieldsize;
  }
  if(Curl_sha256it(sha_hash, (const unsigned char *) post_data,
                   post_data_len))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash, sizeof(sha_hex));

  {
    Curl_HttpReq httpreq;
    const char *method;

    Curl_http_method(data, conn, &method, &httpreq);

    canonical_request =
      curl_maprintf("%s\n" /* HTTPRequestMethod */
                    "%s\n" /* CanonicalURI */
                    "%s\n" /* CanonicalQueryString */
                    "%s\n" /* CanonicalHeaders */
                    "%s\n" /* SignedHeaders */
                    "%s",  /* HashedRequestPayload in hex */
                    method,
                    data->state.up.path,
                    data->state.up.query ? data->state.up.query : "",
                    Curl_dyn_ptr(&canonical_headers),
                    Curl_dyn_ptr(&signed_headers),
                    sha_hex);
    if(!canonical_request)
      goto fail;
  }

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = curl_maprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = curl_maprintf("%s/%s/%s/%s",
                                   date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash, sizeof(sha_hex));

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we ony support HMAC.
   */
  str_to_sign = curl_maprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                              "%s\n" /* RequestDateTime */
                              "%s\n" /* CredentialScope */
                              "%s",  /* HashedCanonicalRequest in hex */
                              provider0,
                              timestamp,
                              credential_scope,
                              sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = curl_maprintf("%s4%s", provider0,
                         data->state.aptr.passwd ?
                         data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0, sizeof(sha_hex));

  /* provider 0 uppercase */
  auth_headers = curl_maprintf("Authorization: %s4-HMAC-SHA256 "
                               "Credential=%s/%s, "
                               "SignedHeaders=%s, "
                               "Signature=%s\r\n"
                               "%s\r\n",
                               provider0,
                               user,
                               credential_scope,
                               Curl_dyn_ptr(&signed_headers),
                               sha_hex,
                               date_header);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  ret = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return ret;
}